

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGrow *curr)

{
  undefined8 uVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ExpressionRunner<wasm::ModuleRunner> *pEVar6;
  Literal *pLVar7;
  ModuleRunner *pMVar8;
  long lVar9;
  address64_t aVar10;
  ulong uVar11;
  Name NVar12;
  Index newSize;
  Address local_208;
  Address maxTableSize;
  Type TStack_1f8;
  Index delta;
  Literal local_1f0;
  undefined1 local_1d8 [8];
  Flow fail;
  Literal local_188;
  undefined1 local_170 [8];
  Flow ret;
  Index tableSize;
  undefined1 local_f0 [8];
  TableInterfaceInfo info;
  Name tableName;
  undefined1 local_c0 [8];
  Flow deltaFlow;
  undefined1 local_68 [8];
  Flow valueFlow;
  TableGrow *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  valueFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar6 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar6,
             *(Expression **)(valueFlow.breakTo.super_IString.str._M_str + 0x20));
  bVar3 = Flow::breaking((Flow *)local_68);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    deltaFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    pEVar6 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)local_c0,pEVar6,
               *(Expression **)(valueFlow.breakTo.super_IString.str._M_str + 0x28));
    bVar3 = Flow::breaking((Flow *)local_c0);
    if (bVar3) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_c0);
      deltaFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
    }
    else {
      info.name.super_IString.str._M_str =
           *(char **)&((IString *)(valueFlow.breakTo.super_IString.str._M_str + 0x10))->str;
      uVar1 = *(undefined8 *)(valueFlow.breakTo.super_IString.str._M_str + 0x18);
      getTableInterfaceInfo
                ((TableInterfaceInfo *)local_f0,this,
                 (Name)((IString *)(valueFlow.breakTo.super_IString.str._M_str + 0x10))->str);
      ret.breakTo.super_IString.str._M_str._0_4_ = info.name.super_IString.str._M_str._0_4_;
      ret.breakTo.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_str._4_4_;
      uVar4 = (*(*(_func_int ***)local_f0)[0x1b])(local_f0,info.name.super_IString.str._M_str,uVar1)
      ;
      Type::Type((Type *)&fail.breakTo.super_IString.str._M_str,i32);
      wasm::Literal::makeFromInt32(&local_188,uVar4,(Type)fail.breakTo.super_IString.str._M_str);
      Flow::Flow((Flow *)local_170,&local_188);
      ::wasm::Literal::~Literal(&local_188);
      Type::Type(&stack0xfffffffffffffe08,i32);
      wasm::Literal::makeFromInt32(&local_1f0,-1,TStack_1f8);
      Flow::Flow((Flow *)local_1d8,&local_1f0);
      ::wasm::Literal::~Literal(&local_1f0);
      pLVar7 = Flow::getSingleValue((Flow *)local_c0);
      maxTableSize.addr._4_4_ = wasm::Literal::geti32(pLVar7);
      if (uVar4 < -maxTableSize.addr._4_4_ - 1) {
        pMVar8 = self(this);
        NVar12.super_IString.str._M_str = info.name.super_IString.str._M_str;
        NVar12.super_IString.str._M_len =
             (size_t)(pMVar8->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
        lVar9 = ::wasm::Module::getTable(NVar12);
        local_208.addr = *(address64_t *)(lVar9 + 0x40);
        uVar11 = (ulong)maxTableSize.addr._4_4_;
        aVar10 = Address::operator_cast_to_unsigned_long(&local_208);
        pcVar2 = info.name.super_IString.str._M_str;
        if (aVar10 < uVar4 + uVar11) {
          Flow::Flow(__return_storage_ptr__,(Flow *)local_1d8);
        }
        else {
          uVar5 = uVar4 + maxTableSize.addr._4_4_;
          pLVar7 = Flow::getSingleValue((Flow *)local_68);
          uVar4 = (*(*(_func_int ***)local_f0)[7])
                            (local_f0,pcVar2,uVar1,pLVar7,(ulong)uVar4,(ulong)uVar5);
          if ((uVar4 & 1) == 0) {
            Flow::Flow(__return_storage_ptr__,(Flow *)local_1d8);
          }
          else {
            Flow::Flow(__return_storage_ptr__,(Flow *)local_170);
          }
        }
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_1d8);
      }
      deltaFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
      Flow::~Flow((Flow *)local_1d8);
      Flow::~Flow((Flow *)local_170);
    }
    Flow::~Flow((Flow *)local_c0);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGrow(TableGrow* curr) {
    NOTE_ENTER("TableGrow");
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow deltaFlow = self()->visit(curr->delta);
    if (deltaFlow.breaking()) {
      return deltaFlow;
    }
    Name tableName = curr->table;
    auto info = getTableInterfaceInfo(tableName);

    Index tableSize = info.interface->tableSize(tableName);
    Flow ret = Literal::makeFromInt32(tableSize, Type::i32);
    Flow fail = Literal::makeFromInt32(-1, Type::i32);
    Index delta = deltaFlow.getSingleValue().geti32();

    if (tableSize >= uint32_t(-1) - delta) {
      return fail;
    }
    auto maxTableSize = self()->wasm.getTable(tableName)->max;
    if (uint64_t(tableSize) + uint64_t(delta) > uint64_t(maxTableSize)) {
      return fail;
    }
    Index newSize = tableSize + delta;
    if (!info.interface->growTable(
          tableName, valueFlow.getSingleValue(), tableSize, newSize)) {
      // We failed to grow the table in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    return ret;
  }